

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Random.cpp
# Opt level: O0

Real amrex::RandomNormal(Real mean,Real stddev)

{
  int iVar1;
  result_type_conflict rVar2;
  int tid;
  normal_distribution<double> distribution;
  undefined4 in_stack_ffffffffffffffc8;
  normal_distribution<double> *in_stack_ffffffffffffffd0;
  result_type_conflict in_stack_ffffffffffffffd8;
  normal_distribution<double> *in_stack_ffffffffffffffe0;
  
  std::normal_distribution<double>::normal_distribution
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (result_type_conflict)in_stack_ffffffffffffffd0);
  iVar1 = OpenMP::get_thread_num();
  Vector<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::allocator<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  ::operator[]((Vector<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::allocator<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                *)in_stack_ffffffffffffffd0,CONCAT44(iVar1,in_stack_ffffffffffffffc8));
  rVar2 = std::normal_distribution<double>::operator()
                    (in_stack_ffffffffffffffd0,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)CONCAT44(iVar1,in_stack_ffffffffffffffc8));
  return rVar2;
}

Assistant:

amrex::Real amrex::RandomNormal (amrex::Real mean, amrex::Real stddev)
{
    std::normal_distribution<amrex::Real> distribution(mean, stddev);
    int tid = OpenMP::get_thread_num();
    return distribution(generators[tid]);
}